

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall CcsTest_Memory_Test::TestBody(CcsTest_Memory_Test *this)

{
  bool bVar1;
  CcsDomain *this_00;
  string *rhs;
  char *message;
  allocator local_274;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  string local_270;
  string local_250;
  string local_230;
  AssertionResult gtest_ar;
  CcsContext local_1f0;
  CcsContext ctx;
  CcsContext root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  istringstream input;
  
  this_00 = (CcsDomain *)operator_new(8);
  ::ccs::CcsDomain::CcsDomain(this_00,false);
  std::__cxx11::string::string
            ((string *)&local_250,"foo.bar > baz.quux: frob = \'nitz\'",(allocator *)&local_270);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&local_250,_S_in);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_250,"<literal>",(allocator *)&local_270);
  ::ccs::CcsDomain::loadCcsStream
            (this_00,(istream *)&input,&local_250,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_250);
  ::ccs::CcsDomain::build((CcsDomain *)&root);
  ::ccs::CcsDomain::~CcsDomain(this_00);
  operator_delete(this_00,8);
  std::__cxx11::string::string((string *)&local_250,"foo",&local_271);
  std::__cxx11::string::string((string *)&local_270,"bar",&local_272);
  anon_unknown.dwarf_2c58d::v(&local_1a8,&local_270);
  ::ccs::CcsContext::CcsContext(&local_1f0,&root,&local_250,&local_1a8);
  std::__cxx11::string::string((string *)&gtest_ar,"baz",&local_273);
  std::__cxx11::string::string((string *)&local_230,"quux",&local_274);
  anon_unknown.dwarf_2c58d::v(&local_1c0,&local_230);
  ::ccs::CcsContext::CcsContext(&ctx,&local_1f0,(string *)&gtest_ar,&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1f0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity = 0;
  local_250.field_2._8_8_ = 0;
  local_250._M_string_length = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_270,"frob",(allocator *)&local_230);
    rhs = ::ccs::CcsContext::getString(&ctx,&local_270);
    testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"nitz\"","ctx.getString(\"frob\")",(char (*) [5])"nitz",rhs);
    std::__cxx11::string::~string((string *)&local_270);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_270);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
                 ,0x23,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_270);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
      if ((long *)local_270._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_270._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  std::__cxx11::string::~string((string *)&local_250);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  return;
}

Assistant:

TEST(CcsTest, Memory) {
  CcsDomain *ccs = new CcsDomain();
  std::istringstream input("foo.bar > baz.quux: frob = 'nitz'");
  ccs->loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs->build();
  delete ccs;
  CcsContext ctx = root.constrain("foo", v("bar")).constrain("baz", v("quux"));
  ASSERT_NO_THROW(EXPECT_EQ("nitz", ctx.getString("frob")));
}